

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void lzma_get_progress(lzma_stream *strm,uint64_t *progress_in,uint64_t *progress_out)

{
  uint64_t *progress_out_local;
  uint64_t *progress_in_local;
  lzma_stream *strm_local;
  
  if ((strm->internal->next).get_progress == (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0) {
    *progress_in = strm->total_in;
    *progress_out = strm->total_out;
  }
  else {
    (*(strm->internal->next).get_progress)((strm->internal->next).coder,progress_in,progress_out);
  }
  return;
}

Assistant:

extern LZMA_API(void)
lzma_get_progress(lzma_stream *strm,
		uint64_t *progress_in, uint64_t *progress_out)
{
	if (strm->internal->next.get_progress != NULL) {
		strm->internal->next.get_progress(strm->internal->next.coder,
				progress_in, progress_out);
	} else {
		*progress_in = strm->total_in;
		*progress_out = strm->total_out;
	}

	return;
}